

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O2

int __thiscall
GeneticAlgorithm::findMaxCacheNumber
          (GeneticAlgorithm *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parent)

{
  pointer ppCVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  pointer pbVar6;
  int local_7c;
  vector<CacheServer_*,_std::allocator<CacheServer_*>_> caches;
  string gene;
  
  pbVar6 = (parent->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::vector<CacheServer_*,_std::allocator<CacheServer_*>_>::vector
            (&caches,&(this->dataCenter).caches);
  iVar5 = -1;
  local_7c = 0;
  for (lVar4 = 0;
      lVar4 != ((long)(parent->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(parent->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) + -1; lVar4 = lVar4 + 1) {
    std::__cxx11::string::string((string *)&gene,(string *)pbVar6);
    ppCVar1 = caches.super__Vector_base<CacheServer_*,_std::allocator<CacheServer_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar3 = (long)local_7c;
    if (iVar5 == -1) {
      iVar5 = (int)caches.super__Vector_base<CacheServer_*,_std::allocator<CacheServer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar3]->maxCapacity;
    }
    iVar2 = atoi(gene._M_dataplus._M_p);
    iVar2 = (this->dataCenter).videos.super__Vector_base<Video,_std::allocator<Video>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2].size;
    if (iVar5 < iVar2) {
      local_7c = local_7c + 1;
      iVar5 = (int)ppCVar1[lVar3 + 1]->maxCapacity;
    }
    iVar5 = iVar5 - iVar2;
    pbVar6 = pbVar6 + 1;
    std::__cxx11::string::~string((string *)&gene);
  }
  std::_Vector_base<CacheServer_*,_std::allocator<CacheServer_*>_>::~_Vector_base
            (&caches.super__Vector_base<CacheServer_*,_std::allocator<CacheServer_*>_>);
  return local_7c;
}

Assistant:

int GeneticAlgorithm::findMaxCacheNumber(std::vector<std::string> parent) {
    int freeSpace1 = -1;
    int parent1Count = 0;
    int actualCache = 0;
    std::vector<std::string>::iterator parentIterator = parent.begin();
    std::vector<CacheServer *> caches = this->dataCenter.caches;
    for (;;) {
        if(parent1Count == parent.size() -1) break;
        std::string gene  = *parentIterator;
        CacheServer *cacheServer = caches[actualCache];
        if(freeSpace1 == -1) freeSpace1 = cacheServer->maxCapacity;
        Video video = dataCenter.videos[atoi(gene.c_str())];
        if(video.size <= freeSpace1){
            freeSpace1 = freeSpace1 - video.size;
        }
        else{
            actualCache++;
            cacheServer = caches[actualCache];
            freeSpace1 = cacheServer->maxCapacity ;
            freeSpace1 = freeSpace1 - video.size ;
        }
        parent1Count++;
        parentIterator++;
    }
    return actualCache;
}